

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

int __thiscall
mpt::message_store::entry::set(entry *this,char *from,int type,char *fmt,__va_list_tag *arg)

{
  content *pcVar1;
  int iVar2;
  reference<mpt::array::content> in_RAX;
  undefined1 *puVar3;
  size_t sVar4;
  void *pvVar5;
  undefined1 *puVar6;
  int iVar7;
  undefined1 uVar8;
  size_t len;
  array d;
  
  d._buf._ref = (reference<mpt::array::content>)(reference<mpt::array::content>)in_RAX._ref;
  array::array(&d,0);
  puVar3 = (undefined1 *)array::append(&d,4,(void *)0x0);
  iVar7 = -1;
  if (puVar3 != (undefined1 *)0x0) {
    *(undefined2 *)(puVar3 + 1) = 0;
    *puVar3 = 0;
    puVar3[3] = (char)type;
    if (from == (char *)0x0) {
      uVar8 = 0;
    }
    else {
      sVar4 = strlen(from);
      if (sVar4 < 0xff) {
        len = sVar4 + 1;
        pvVar5 = array::append(&d,len,from);
      }
      else {
        pvVar5 = array::append(&d,0xff,from);
        if (pvVar5 == (void *)0x0) goto LAB_001307be;
        pvVar5 = array::append(&d,1,"");
        len = 0xff;
      }
      uVar8 = (undefined1)len;
      if (pvVar5 == (void *)0x0) goto LAB_001307be;
    }
    puVar6 = (undefined1 *)0x0;
    puVar3 = (undefined1 *)((long)d._buf._ref + 0x20);
    if (*(long *)((long)d._buf._ref + 8) != 0) {
      puVar3 = puVar6;
    }
    *puVar3 = uVar8;
    if (fmt != (char *)0x0) {
      iVar2 = mpt_vprintf(&d,fmt,arg);
      if (iVar2 < 0) goto LAB_001307be;
      puVar3 = (undefined1 *)0x0;
      if (*(long *)((long)d._buf._ref + 8) == 0) {
        puVar3 = (undefined1 *)((long)d._buf._ref + 0x20);
      }
      puVar6 = (undefined1 *)0x1;
    }
    puVar3[1] = (char)puVar6;
    mpt_array_clone(this,&d);
    pcVar1 = (this->super_array)._buf._ref;
    iVar7 = 0;
    if ((pcVar1 != (content *)0x0) && (*(long *)(pcVar1 + 8) == 0)) {
      iVar7 = *(int *)(pcVar1 + 0x18);
    }
  }
LAB_001307be:
  reference<mpt::array::content>::~reference(&d._buf);
  return iVar7;
}

Assistant:

int message_store::entry::set(const char *from, int type, const char *fmt, va_list arg)
{
	header *h;
	array d;
	size_t len;
	
	if (!(h = static_cast<header *>(d.append(sizeof(*h))))) {
		return -1;
	}
	h->args = 0;
	h->from = 0;
	h->type = type;
	h->_cmd = 0;
	
	static const size_t maxlen = std::numeric_limits<__decltype(h->from)>::max();
	if (!from) {
		len = 0;
	}
	else if ((len = strlen(from)) >= maxlen) {
		static const char end = 0;
		if (!(d.append(maxlen, from)) || !(d.append(1, &end))) {
			return -1;
		}
		len = maxlen;
	} else {
		if (!(d.append(++len, from))) {
			return -1;
		}
	}
	h = static_cast<header *>(d.base());
	h->from = len;
	
	if (!fmt) {
		h->args = 0;
	}
	else if (mpt_vprintf(&d, fmt, arg) < 0) {
		return -1;
	} else {
		h = static_cast<header *>(d.base());
		h->args = 1;
	}
	
	mpt_array_clone(this, &d);
	
	return length();
}